

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall CMeshClosestPointMapper::TcSeamlessPatch::~TcSeamlessPatch(TcSeamlessPatch *this)

{
  pointer piVar1;
  
  this->_vptr_TcSeamlessPatch = (_func_int **)&PTR__TcSeamlessPatch_00813858;
  piVar1 = (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  piVar1 = (this->m_bannedFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_bannedFis).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  piVar1 = (this->m_fis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_fis).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)piVar1);
    return;
  }
  return;
}

Assistant:

void Create(int fi, int steps)
    {
      m_fis.reserve(25);
      Expand(fi, 0);
      for (int step = 1; step <= steps; step++)
      {
        std::vector<int> stepFis = m_nextStepFis;
        m_nextStepFis.clear();
        for (int nfi : stepFis)
        {
          Expand(nfi, step);
        }
      }
    }